

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O3

bool __thiscall
draco::KdTreeAttributesEncoder::EncodeDataNeededByPortableTransforms
          (KdTreeAttributesEncoder *this,EncoderBuffer *out_buffer)

{
  uint uVar1;
  ulong uVar2;
  pointer piVar3;
  uint val;
  pointer pAVar4;
  ulong uVar5;
  long lVar6;
  
  pAVar4 = (this->attribute_quantization_transforms_).
           super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->attribute_quantization_transforms_).
      super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      (**(code **)(*(long *)((long)&(pAVar4->super_AttributeTransform)._vptr_AttributeTransform +
                            lVar6) + 0x38))
                ((long)&(pAVar4->super_AttributeTransform)._vptr_AttributeTransform + lVar6,
                 out_buffer);
      uVar5 = uVar5 + 1;
      pAVar4 = (this->attribute_quantization_transforms_).
               super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->attribute_quantization_transforms_).
                     super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4 >> 4) *
              -0x5555555555555555;
      lVar6 = lVar6 + 0x30;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  piVar3 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    uVar5 = 0;
    do {
      uVar1 = piVar3[uVar5];
      val = ~uVar1 * 2 + 1;
      if (-1 < (int)uVar1) {
        val = uVar1 * 2;
      }
      EncodeVarint<unsigned_int>(val,out_buffer);
      uVar5 = uVar5 + 1;
      piVar3 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->min_signed_values_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
  }
  return true;
}

Assistant:

bool KdTreeAttributesEncoder::EncodeDataNeededByPortableTransforms(
    EncoderBuffer *out_buffer) {
  // Store quantization settings for all attributes that need it.
  for (int i = 0; i < attribute_quantization_transforms_.size(); ++i) {
    attribute_quantization_transforms_[i].EncodeParameters(out_buffer);
  }

  // Encode data needed for transforming signed integers to unsigned ones.
  for (int i = 0; i < min_signed_values_.size(); ++i) {
    EncodeVarint<int32_t>(min_signed_values_[i], out_buffer);
  }
  return true;
}